

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O0

void __thiscall FileTest_ReadFile_Test::FileTest_ReadFile_Test(FileTest_ReadFile_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__FileTest_ReadFile_Test_00197038;
  return;
}

Assistant:

TEST(FileTest, ReadFile) {
  FILE* file = OpenFileOrDie("./tmp.bin", "w");
  int num = 999;
  WriteDataToDisk(file, (char*)&num, sizeof(num));
  Close(file);
  char* ch_num = nullptr;
  uint64 len = ReadFileToMemory("./tmp.bin", &ch_num);
  EXPECT_EQ(len, sizeof(num));
  EXPECT_EQ((*(int*)ch_num), 999);
  RemoveFile("./tmp.bin");
}